

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O0

int __thiscall deqp::ShaderIntegerMixTests::init(ShaderIntegerMixTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  TestNode *pTVar1;
  ulong extraout_RAX;
  ostream *poVar2;
  ShaderIntegerMixRenderCase *this_00;
  char *name_00;
  char *description_00;
  ulong uVar3;
  string local_370 [32];
  string local_350 [32];
  stringstream local_330 [8];
  stringstream description;
  ostream local_320;
  stringstream local_1a8 [8];
  stringstream name;
  ostream local_198;
  uint local_20;
  int i;
  ShaderIntegerMixTests *local_10;
  ShaderIntegerMixTests *this_local;
  
  local_10 = this;
  pTVar1 = (TestNode *)operator_new(0x80);
  ShaderIntegerMixDefineCase::ShaderIntegerMixDefineCase
            ((ShaderIntegerMixDefineCase *)pTVar1,(this->super_TestCaseGroup).m_context,"define",
             "Verify GL_EXT_shader_integer_mix is defined to 1.",this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  ShaderIntegerMixPrototypesCase::ShaderIntegerMixPrototypesCase
            ((ShaderIntegerMixPrototypesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "prototypes-extension",
             "Verify availability of all function signatures with the extension.",
             this->m_glslVersion,true);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  ShaderIntegerMixPrototypesCase::ShaderIntegerMixPrototypesCase
            ((ShaderIntegerMixPrototypesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "prototypes",
             "Verify availability of all function signatures with the proper GLSL version.",
             this->m_glslVersion,false);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_20 = 0;
  uVar3 = extraout_RAX;
  while ((int)local_20 < 3) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(&local_198,"mix-");
    std::operator<<(poVar2,init::types_to_test[(int)local_20]);
    std::__cxx11::stringstream::stringstream(local_330);
    poVar2 = std::operator<<(&local_320,"Verify functionality of mix() with ");
    poVar2 = std::operator<<(poVar2,init::types_to_test[(int)local_20]);
    std::operator<<(poVar2," parameters.");
    this_00 = (ShaderIntegerMixRenderCase *)operator_new(0x88);
    context = (this->super_TestCaseGroup).m_context;
    std::__cxx11::stringstream::str();
    name_00 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    description_00 = (char *)std::__cxx11::string::c_str();
    ShaderIntegerMixRenderCase::ShaderIntegerMixRenderCase
              (this_00,context,name_00,description_00,this->m_glslVersion,
               init::types_to_test[(int)local_20]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::stringstream::~stringstream(local_330);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    local_20 = local_20 + 1;
    uVar3 = (ulong)local_20;
  }
  return (int)uVar3;
}

Assistant:

void ShaderIntegerMixTests::init(void)
{
	addChild(new ShaderIntegerMixDefineCase(m_context, "define", "Verify GL_EXT_shader_integer_mix is defined to 1.",
											m_glslVersion));
	addChild(new ShaderIntegerMixPrototypesCase(m_context, "prototypes-extension",
												"Verify availability of all function signatures with the extension.",
												m_glslVersion, true));
	addChild(new ShaderIntegerMixPrototypesCase(
		m_context, "prototypes", "Verify availability of all function signatures with the proper GLSL version.",
		m_glslVersion, false));

	static const char* types_to_test[] = { "ivec4", "uvec4", "bvec4" };

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(types_to_test); i++)
	{
		std::stringstream name;

		name << "mix-" << types_to_test[i];

		std::stringstream description;

		description << "Verify functionality of mix() with " << types_to_test[i] << " parameters.";

		addChild(new ShaderIntegerMixRenderCase(m_context, name.str().c_str(), description.str().c_str(), m_glslVersion,
												types_to_test[i]));
	}
}